

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Stat4ProbeSetValue
              (Parse *pParse,Index *pIdx,UnpackedRecord **ppRec,Expr *pExpr,int nElem,int iVal,
              int *pnExtract)

{
  u8 affinity;
  int iVar1;
  Expr *pExpr_00;
  int i;
  undefined4 in_register_0000008c;
  int iVar2;
  ValueNewStat4Ctx alloc;
  sqlite3_value *local_60;
  undefined8 local_58;
  ValueNewStat4Ctx local_50;
  
  local_58 = CONCAT44(in_register_0000008c,iVal);
  if (pExpr != (Expr *)0x0) {
    iVar1 = 0;
    iVar2 = 0;
    if (pExpr->op == 0x83) goto LAB_001796d3;
  }
  i = 0;
  if (nElem < 1) {
    nElem = 0;
  }
  iVar1 = 0;
  local_50.pParse = pParse;
  local_50.pIdx = pIdx;
  local_50.ppRec = ppRec;
  for (; iVar2 = nElem, nElem != i; i = i + 1) {
    local_60 = (sqlite3_value *)0x0;
    if (pExpr == (Expr *)0x0) {
      pExpr_00 = (Expr *)0x0;
    }
    else {
      pExpr_00 = sqlite3VectorFieldSubexpr(pExpr,i);
    }
    iVar2 = (int)local_58 + i;
    affinity = sqlite3IndexColumnAffinity(pParse->db,pIdx,iVar2);
    local_50.iVal = iVar2;
    iVar1 = stat4ValueFromExpr(pParse,pExpr_00,affinity,&local_50,&local_60);
    iVar2 = i;
    if (local_60 == (sqlite3_value *)0x0) break;
  }
LAB_001796d3:
  *pnExtract = iVar2;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Stat4ProbeSetValue(
  Parse *pParse,                  /* Parse context */
  Index *pIdx,                    /* Index being probed */
  UnpackedRecord **ppRec,         /* IN/OUT: Probe record */
  Expr *pExpr,                    /* The expression to extract a value from */
  int nElem,                      /* Maximum number of values to append */
  int iVal,                       /* Array element to populate */
  int *pnExtract                  /* OUT: Values appended to the record */
){
  int rc = SQLITE_OK;
  int nExtract = 0;

  if( pExpr==0 || pExpr->op!=TK_SELECT ){
    int i;
    struct ValueNewStat4Ctx alloc;

    alloc.pParse = pParse;
    alloc.pIdx = pIdx;
    alloc.ppRec = ppRec;

    for(i=0; i<nElem; i++){
      sqlite3_value *pVal = 0;
      Expr *pElem = (pExpr ? sqlite3VectorFieldSubexpr(pExpr, i) : 0);
      u8 aff = sqlite3IndexColumnAffinity(pParse->db, pIdx, iVal+i);
      alloc.iVal = iVal+i;
      rc = stat4ValueFromExpr(pParse, pElem, aff, &alloc, &pVal);
      if( !pVal ) break;
      nExtract++;
    }
  }

  *pnExtract = nExtract;
  return rc;
}